

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLut.cpp
# Opt level: O0

void testLut(string *param_1)

{
  ostream *poVar1;
  exception *e;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing lookup tables");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_142438::testHalfLut();
  anon_unknown.dwarf_142438::testRgbaLut();
  anon_unknown.dwarf_142438::testRounding();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testLut (const std::string&)
{
    try
    {
        cout << "Testing lookup tables" << endl;

        testHalfLut ();
        testRgbaLut ();
        testRounding ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}